

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O2

void __thiscall llvm::Twine::printOneChildRepr(Twine *this,raw_ostream *OS,Child Ptr,NodeKind Kind)

{
  raw_ostream *prVar1;
  undefined7 in_register_00000009;
  unsigned_long N;
  char *pcVar2;
  
  switch(CONCAT71(in_register_00000009,Kind) & 0xffffffff) {
  case 0:
    pcVar2 = "null";
    goto LAB_00188777;
  case 1:
    pcVar2 = "empty";
    goto LAB_00188777;
  case 2:
    raw_ostream::operator<<(OS,"rope:");
    printRepr(Ptr.twine,OS);
    return;
  case 3:
    prVar1 = raw_ostream::operator<<(OS,"cstring:\"");
    OS = raw_ostream::operator<<(prVar1,Ptr.cString);
    break;
  case 4:
    pcVar2 = "std::string:\"";
    goto LAB_001886eb;
  case 5:
    pcVar2 = "stringref:\"";
    goto LAB_001886eb;
  case 6:
    prVar1 = raw_ostream::operator<<(OS,"smallstring:\"");
    OS = raw_ostream::operator<<(prVar1,Ptr.smallString);
    break;
  case 7:
    prVar1 = raw_ostream::operator<<(OS,"formatv:\"");
    OS = raw_ostream::operator<<(prVar1,Ptr.formatvObject);
    break;
  case 8:
    prVar1 = raw_ostream::operator<<(OS,"char:\"");
    OS = raw_ostream::operator<<(prVar1,Ptr.character);
    break;
  case 9:
    prVar1 = raw_ostream::operator<<(OS,"decUI:\"");
    N = (ulong)Ptr.twine & 0xffffffff;
    goto LAB_00188660;
  case 10:
    prVar1 = raw_ostream::operator<<(OS,"decI:\"");
    OS = raw_ostream::operator<<(prVar1,Ptr.decI);
    break;
  case 0xb:
    prVar1 = raw_ostream::operator<<(OS,"decUL:\"");
    N = *Ptr.decUL;
LAB_00188660:
    OS = raw_ostream::operator<<(prVar1,N);
    break;
  case 0xc:
    prVar1 = raw_ostream::operator<<(OS,"decL:\"");
    OS = raw_ostream::operator<<(prVar1,*Ptr.decL);
    break;
  case 0xd:
    prVar1 = raw_ostream::operator<<(OS,"decULL:\"");
    OS = raw_ostream::operator<<(prVar1,*Ptr.decULL);
    break;
  case 0xe:
    prVar1 = raw_ostream::operator<<(OS,"decLL:\"");
    OS = raw_ostream::operator<<(prVar1,*Ptr.decLL);
    break;
  case 0xf:
    pcVar2 = "uhex:\"";
LAB_001886eb:
    prVar1 = raw_ostream::operator<<(OS,pcVar2);
    OS = raw_ostream::operator<<(prVar1,Ptr.twine);
    break;
  default:
    return;
  }
  pcVar2 = "\"";
LAB_00188777:
  raw_ostream::operator<<(OS,pcVar2);
  return;
}

Assistant:

void Twine::printOneChildRepr(raw_ostream &OS, Child Ptr,
                              NodeKind Kind) const {
  switch (Kind) {
  case Twine::NullKind:
    OS << "null"; break;
  case Twine::EmptyKind:
    OS << "empty"; break;
  case Twine::TwineKind:
    OS << "rope:";
    Ptr.twine->printRepr(OS);
    break;
  case Twine::CStringKind:
    OS << "cstring:\""
       << Ptr.cString << "\"";
    break;
  case Twine::StdStringKind:
    OS << "std::string:\""
       << Ptr.stdString << "\"";
    break;
  case Twine::StringRefKind:
    OS << "stringref:\""
       << Ptr.stringRef << "\"";
    break;
  case Twine::SmallStringKind:
    OS << "smallstring:\"" << *Ptr.smallString << "\"";
    break;
  case Twine::FormatvObjectKind:
    OS << "formatv:\"" << *Ptr.formatvObject << "\"";
    break;
  case Twine::CharKind:
    OS << "char:\"" << Ptr.character << "\"";
    break;
  case Twine::DecUIKind:
    OS << "decUI:\"" << Ptr.decUI << "\"";
    break;
  case Twine::DecIKind:
    OS << "decI:\"" << Ptr.decI << "\"";
    break;
  case Twine::DecULKind:
    OS << "decUL:\"" << *Ptr.decUL << "\"";
    break;
  case Twine::DecLKind:
    OS << "decL:\"" << *Ptr.decL << "\"";
    break;
  case Twine::DecULLKind:
    OS << "decULL:\"" << *Ptr.decULL << "\"";
    break;
  case Twine::DecLLKind:
    OS << "decLL:\"" << *Ptr.decLL << "\"";
    break;
  case Twine::UHexKind:
    OS << "uhex:\"" << Ptr.uHex << "\"";
    break;
  }
}